

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ReturnStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ReturnStatementSyntax,slang::syntax::ReturnStatementSyntax_const&>
          (BumpAllocator *this,ReturnStatementSyntax *args)

{
  ReturnStatementSyntax *pRVar1;
  ReturnStatementSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pRVar1 = (ReturnStatementSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::ReturnStatementSyntax::ReturnStatementSyntax(in_RSI,pRVar1);
  return pRVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }